

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_ColorStop>::Append(ON_SimpleArray<ON_ColorStop> *this,ON_ColorStop *x)

{
  undefined4 uVar1;
  int iVar2;
  ON_ColorStop *pOVar3;
  void *temp;
  ON_ColorStop *pOStack_20;
  int newcapacity;
  ON_ColorStop *p;
  ON_ColorStop *x_local;
  ON_SimpleArray<ON_ColorStop> *this_local;
  
  pOStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar2 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOStack_20 = (ON_ColorStop *)onmalloc(0x10);
      uVar1 = *(undefined4 *)&x->field_0x4;
      pOStack_20->m_color = (ON_Color)(x->m_color).field_0;
      *(undefined4 *)&pOStack_20->field_0x4 = uVar1;
      pOStack_20->m_position = x->m_position;
    }
    Reserve(this,(long)iVar2);
    if (this->m_a == (ON_ColorStop *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  pOVar3 = this->m_a + iVar2;
  uVar1 = *(undefined4 *)&pOStack_20->field_0x4;
  pOVar3->m_color = (ON_Color)(pOStack_20->m_color).field_0;
  *(undefined4 *)&pOVar3->field_0x4 = uVar1;
  pOVar3->m_position = pOStack_20->m_position;
  if (pOStack_20 != x) {
    onfree(pOStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}